

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::RunContext::handleNonExpr
          (RunContext *this,AssertionInfo *info,OfType resultType,AssertionReaction *reaction)

{
  char *pcVar1;
  size_type sVar2;
  char *pcVar3;
  size_t sVar4;
  size_type sVar5;
  AssertionResultData data;
  AssertionResult assertionResult;
  AssertionResultData local_100;
  AssertionResult local_a8;
  
  (this->m_lastAssertionInfo).resultDisposition = info->resultDisposition;
  pcVar1 = (info->macroName).m_start;
  sVar2 = (info->macroName).m_size;
  pcVar3 = (info->lineInfo).file;
  sVar4 = (info->lineInfo).line;
  sVar5 = (info->capturedExpression).m_size;
  (this->m_lastAssertionInfo).capturedExpression.m_start = (info->capturedExpression).m_start;
  (this->m_lastAssertionInfo).capturedExpression.m_size = sVar5;
  (this->m_lastAssertionInfo).lineInfo.file = pcVar3;
  (this->m_lastAssertionInfo).lineInfo.line = sVar4;
  (this->m_lastAssertionInfo).macroName.m_start = pcVar1;
  (this->m_lastAssertionInfo).macroName.m_size = sVar2;
  local_100.message._M_dataplus._M_p = (pointer)&local_100.message.field_2;
  local_100.message._M_string_length = 0;
  local_100.message.field_2._M_local_buf[0] = '\0';
  local_100.reconstructedExpression._M_dataplus._M_p =
       (pointer)&local_100.reconstructedExpression.field_2;
  local_100.reconstructedExpression._M_string_length = 0;
  local_100.reconstructedExpression.field_2._M_local_buf[0] = '\0';
  local_100.lazyExpression.m_transientExpression = (ITransientExpression *)0x0;
  local_100.lazyExpression.m_isNegated = false;
  local_a8.m_info._48_8_ = *(undefined8 *)&info->resultDisposition;
  local_a8.m_info.macroName.m_start = (info->macroName).m_start;
  local_a8.m_info.macroName.m_size = (info->macroName).m_size;
  local_a8.m_info.lineInfo.file = (info->lineInfo).file;
  local_a8.m_info.lineInfo.line = (info->lineInfo).line;
  local_a8.m_info.capturedExpression.m_start = (info->capturedExpression).m_start;
  local_a8.m_info.capturedExpression.m_size = (info->capturedExpression).m_size;
  local_100.resultType = resultType;
  AssertionResultData::AssertionResultData(&local_a8.m_resultData,&local_100);
  assertionEnded(this,&local_a8);
  if ((((undefined1)local_a8.m_resultData.resultType & FailureBit) != Ok) &&
     ((local_a8.m_info._48_8_ & 8) == 0)) {
    populateReaction(this,reaction);
  }
  AssertionResultData::~AssertionResultData(&local_a8.m_resultData);
  AssertionResultData::~AssertionResultData(&local_100);
  return;
}

Assistant:

void RunContext::handleNonExpr(
            AssertionInfo const &info,
            ResultWas::OfType resultType,
            AssertionReaction &reaction
    ) {
        m_lastAssertionInfo = info;

        AssertionResultData data( resultType, LazyExpression( false ) );
        AssertionResult assertionResult{ info, data };
        assertionEnded( assertionResult );

        if( !assertionResult.isOk() )
            populateReaction( reaction );
    }